

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform_prepare.cpp
# Opt level: O3

unique_ptr<duckdb::DropStatement,_std::default_delete<duckdb::DropStatement>,_true> __thiscall
duckdb::Transformer::TransformDeallocate(Transformer *this,PGDeallocateStmt *stmt)

{
  Transformer *this_00;
  pointer pDVar1;
  pointer pDVar2;
  ParserException *this_01;
  long in_RDX;
  pointer *__ptr;
  allocator local_41;
  string local_40;
  
  if (*(long *)(in_RDX + 8) != 0) {
    this_00 = (Transformer *)operator_new(0x80);
    DropStatement::DropStatement((DropStatement *)this_00);
    (this->parent).ptr = this_00;
    pDVar1 = unique_ptr<duckdb::DropStatement,_std::default_delete<duckdb::DropStatement>,_true>::
             operator->((unique_ptr<duckdb::DropStatement,_std::default_delete<duckdb::DropStatement>,_true>
                         *)this);
    pDVar2 = unique_ptr<duckdb::DropInfo,_std::default_delete<duckdb::DropInfo>,_true>::operator->
                       (&pDVar1->info);
    (pDVar2->super_ParseInfo).field_0x9 = 5;
    ::std::__cxx11::string::string((string *)&local_40,*(char **)(in_RDX + 8),&local_41);
    pDVar1 = unique_ptr<duckdb::DropStatement,_std::default_delete<duckdb::DropStatement>,_true>::
             operator->((unique_ptr<duckdb::DropStatement,_std::default_delete<duckdb::DropStatement>,_true>
                         *)this);
    pDVar2 = unique_ptr<duckdb::DropInfo,_std::default_delete<duckdb::DropInfo>,_true>::operator->
                       (&pDVar1->info);
    ::std::__cxx11::string::operator=((string *)&pDVar2->name,(string *)&local_40);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p);
    }
    return (unique_ptr<duckdb::DropStatement,_std::default_delete<duckdb::DropStatement>_>)
           (unique_ptr<duckdb::DropStatement,_std::default_delete<duckdb::DropStatement>_>)this;
  }
  this_01 = (ParserException *)__cxa_allocate_exception(0x10);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_40,"DEALLOCATE requires a name","");
  ParserException::ParserException(this_01,&local_40);
  __cxa_throw(this_01,&ParserException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

unique_ptr<DropStatement> Transformer::TransformDeallocate(duckdb_libpgquery::PGDeallocateStmt &stmt) {
	if (!stmt.name) {
		throw ParserException("DEALLOCATE requires a name");
	}

	auto result = make_uniq<DropStatement>();
	result->info->type = CatalogType::PREPARED_STATEMENT;
	result->info->name = string(stmt.name);
	return result;
}